

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node parse_subexpr(Parser *psr,Precedence minimum)

{
  Tk binop_00;
  Precedence PVar1;
  Node NVar2;
  Node right_00;
  Node right;
  Tk binop;
  Precedence minimum_local;
  Parser *psr_local;
  Node left;
  
  NVar2 = expr_unary(psr);
  left._0_8_ = NVar2.field_1;
  psr_local._0_4_ = NVar2.type;
  while( true ) {
    PVar1 = binop_prec((psr->lxr).tk.type);
    if (PVar1 <= minimum) break;
    binop_00 = (psr->lxr).tk.type;
    lex_next(&psr->lxr);
    expr_emit_binary_left(psr,binop_00,(Node *)&psr_local);
    PVar1 = binop_prec(binop_00);
    NVar2 = parse_subexpr(psr,PVar1);
    right_00._4_4_ = 0;
    right_00.type = NVar2.type;
    right_00.field_1 = NVar2.field_1;
    expr_emit_binary(psr,binop_00,(Node *)&psr_local,right_00);
  }
  NVar2._4_4_ = 0;
  NVar2.type = (NodeType)psr_local;
  NVar2.field_1 = (anon_union_8_6_f630ca3c_for_Node_1)left._0_8_;
  return NVar2;
}

Assistant:

static Node parse_subexpr(Parser *psr, Precedence minimum) {
	// Parse the left operand to the binary operation
	Node left = expr_unary(psr);

	// Keep parsing binary operators until we encounter one with a precedence
	// less than the minimum
	// We need the explicit cast to an int, or else it tries to convert -1
	// returned by `binop_prec` into an unsigned value
	while (binop_prec(psr->lxr.tk.type) > minimum) {
		// Skip the binary operator token
		Tk binop = psr->lxr.tk.type;
		lex_next(&psr->lxr);

		// Some binary operations require us to emit code for the left operand
		// BEFORE we parse the right one
		expr_emit_binary_left(psr, binop, &left);

		// Parse the right operand to the binary operator
		Node right = parse_subexpr(psr, binop_prec(binop));

		// Emit bytecode for the whole binary operation
		expr_emit_binary(psr, binop, &left, right);
	}
	return left;
}